

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastEqBoolInt(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int32 iVar11;
  undefined4 *puVar12;
  BranchInstr *pBVar13;
  LabelInstr *pLVar14;
  IntConstOpnd *pIVar15;
  undefined7 uVar23;
  AddrOpnd *pAVar17;
  Opnd *pOVar18;
  RegOpnd *pRVar19;
  Opnd *pOVar20;
  LabelInstr *instr_00;
  LabelInstr *pLVar21;
  LabelInstr *pLVar22;
  Func *pFVar24;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar25;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar26;
  Lowerer *this_00;
  LibraryValue LVar27;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_01;
  LibraryValue valueType;
  bool *pbVar28;
  LabelInstr *local_98;
  LabelInstr *local_88;
  LabelInstr *local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_56;
  LibraryValue local_54;
  bool *local_50;
  undefined8 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  IRKind local_35;
  LibraryValue local_34;
  ulong uVar16;
  
  local_50 = pNeedHelper;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bce,"(instr)","instr");
    if (!bVar6) goto LAB_0057312f;
    *puVar12 = 0;
  }
  OVar2 = instr->m_opcode;
  if (((OVar2 - 0x14 < 0x2f) && ((0x600000000003U >> ((ulong)(OVar2 - 0x14) & 0x3f) & 1) != 0)) ||
     (OVar2 - 0x196 < 2)) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  IVar1 = instr->m_kind;
  local_54 = ValueInvalid;
  switch(OVar2) {
  case BrEq_A:
  case BrSrEq_A:
    goto switchD_00572625_caseD_3b;
  case BrNeq_A:
  case BrSrNeq_A:
    break;
  case BrFalse_A:
  case BrTrue_A:
  case BrGe_A:
  case BrGt_A:
  case BrLt_A:
  case BrLe_A:
    goto switchD_00572625_caseD_3c;
  default:
    switch(OVar2) {
    case CmEq_A:
    case CmSrEq_A:
      goto switchD_00572625_caseD_3b;
    case CmGe_A:
    case CmGt_A:
    case CmLt_A:
    case CmLe_A:
      goto switchD_00572625_caseD_3c;
    case CmNeq_A:
    case CmSrNeq_A:
      goto switchD_00572625_caseD_40;
    default:
      switch(OVar2) {
      case BrNotEq_A:
      case BrSrNotEq_A:
        goto switchD_00572625_caseD_40;
      case BrNotNeq_A:
      case BrSrNotNeq_A:
        goto switchD_00572625_caseD_3b;
      }
    }
    goto switchD_00572656_default;
  }
switchD_00572625_caseD_40:
  local_54 = ValueUndeclBlockVar;
switchD_00572625_caseD_3b:
  paVar25 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src1;
  paVar26 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src2;
  local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)this;
  if (paVar25 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0 ||
      paVar26 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bfe,"(src1 && src2)","src1 && src2");
    if (!bVar6) {
LAB_0057312f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  else {
    if (IVar1 == InstrKindBranch) {
      pBVar13 = IR::Instr::AsBranchInstr(instr);
      local_98 = pBVar13->m_branchTarget;
      local_80 = IR::Instr::GetOrCreateContinueLabel(&pBVar13->super_Instr,isInHelper);
    }
    else {
      local_80 = (LabelInstr *)0x0;
      local_98 = (LabelInstr *)0x0;
    }
    *local_50 = true;
    pLVar14 = IR::Instr::GetOrCreateContinueLabel(instr,isInHelper);
    local_38 = paVar25[4];
    bVar7 = ValueType::IsLikelyBoolean((ValueType *)&local_38.field_0);
    if (bVar7) {
      local_56 = paVar26[4];
      bVar7 = ValueType::IsLikelyTaggedInt((ValueType *)&local_56.field_0);
      this_01 = paVar25;
      if (!bVar7) goto LAB_00572757;
LAB_0057278a:
      bVar7 = IR::Opnd::IsIntConstOpnd((Opnd *)&paVar26->field_0);
      if (bVar7) {
        pIVar15 = IR::Opnd::AsIntConstOpnd((Opnd *)&paVar26->field_0);
        uVar16 = (pIVar15->super_EncodableOpnd<long>).m_value;
        if (uVar16 == 0) {
          bVar7 = true;
          local_48 = (LabelInstr *)((ulong)local_48._4_4_ << 0x20);
          local_34 = ValueUndeclBlockVar;
        }
        else if (uVar16 == 1) {
LAB_005727b5:
          uVar23 = (undefined7)(uVar16 >> 8);
          local_34 = (LibraryValue)CONCAT71(uVar23,1);
          local_48 = (LabelInstr *)CONCAT44(local_48._4_4_,(int)CONCAT71(uVar23,1));
          bVar7 = true;
        }
        else {
LAB_0057282f:
          bVar7 = true;
          local_34 = ValueInvalid;
          local_48 = (LabelInstr *)((ulong)local_48._4_4_ << 0x20);
        }
      }
      else {
        bVar7 = IR::Opnd::IsAddrOpnd((Opnd *)&paVar26->field_0);
        if (bVar7) {
          pAVar17 = IR::Opnd::AsAddrOpnd((Opnd *)&paVar26->field_0);
          if (((pAVar17 == (AddrOpnd *)0x0) ||
              ((pAVar17->addrOpndKind != AddrOpndKindDynamicVar &&
               (pAVar17->addrOpndKind != AddrOpndKindConstantVar)))) ||
             (bVar7 = Js::TaggedInt::Is(pAVar17->m_address), !bVar7)) goto switchD_00572656_default;
          uVar10 = Js::TaggedInt::ToInt32(pAVar17->m_address);
          uVar16 = (ulong)uVar10;
          if (uVar10 != 0) {
            if (uVar10 != 1) goto LAB_0057282f;
            goto LAB_005727b5;
          }
          bVar7 = true;
          local_48 = (LabelInstr *)((ulong)local_48._4_4_ << 0x20);
          local_34 = ValueUndeclBlockVar;
        }
        else {
          bVar8 = IR::Opnd::IsConstOpnd((Opnd *)&paVar26->field_0);
          local_34 = ValueInvalid;
          local_48 = (LabelInstr *)((ulong)local_48._4_4_ << 0x20);
          bVar7 = false;
          if (bVar8) {
            return false;
          }
        }
      }
      local_35 = IVar1;
      bVar8 = IR::Opnd::IsIntConstOpnd((Opnd *)&this_01->field_0);
      if (bVar8) {
        pIVar15 = IR::Opnd::AsIntConstOpnd((Opnd *)&this_01->field_0);
        bVar8 = (pIVar15->super_EncodableOpnd<long>).m_value == 0;
LAB_005728a3:
        bVar8 = !bVar8;
        bVar4 = true;
      }
      else {
        bVar8 = IR::Opnd::IsAddrOpnd((Opnd *)&this_01->field_0);
        if (bVar8) {
          pAVar17 = IR::Opnd::AsAddrOpnd((Opnd *)&paVar26->field_0);
          if (((pAVar17 == (AddrOpnd *)0x0) ||
              ((pAVar17->addrOpndKind != AddrOpndKindDynamicVar &&
               (pAVar17->addrOpndKind != AddrOpndKindConstantVar)))) ||
             (bVar8 = Js::TaggedInt::Is(pAVar17->m_address), !bVar8)) goto switchD_00572656_default;
          iVar11 = Js::TaggedInt::ToInt32(pAVar17->m_address);
          bVar8 = iVar11 == 0;
          goto LAB_005728a3;
        }
        bVar9 = IR::Opnd::IsConstOpnd((Opnd *)&this_01->field_0);
        bVar8 = false;
        bVar4 = false;
        if (bVar9) {
          return false;
        }
      }
      local_38 = paVar26[4];
      bVar9 = ValueType::IsTaggedInt((ValueType *)&local_38.field_0);
      if (bVar9) {
        local_56 = this_01[4];
        paVar25 = &local_56;
        bVar9 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
        if (!bVar9) goto LAB_005728f1;
        *local_50 = false;
        local_88 = (LabelInstr *)0x0;
      }
      else {
LAB_005728f1:
        local_88 = IR::LabelInstr::New(Label,*(Func **)local_40,true);
        bVar9 = IR::Opnd::IsConstOpnd((Opnd *)&paVar26->field_0);
        if (!bVar9) {
          local_38 = paVar26[4];
          bVar9 = ValueType::IsTaggedInt((ValueType *)&local_38.field_0);
          if (!bVar9) {
            paVar25 = local_40 + 4;
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
            LowererMD::GenerateSmIntTest
                      ((LowererMD *)&paVar25->field_0,&pRVar19->super_Opnd,instr,local_88,
                       (Instr **)0x0,false);
          }
        }
        paVar25 = this_01;
        bVar9 = IR::Opnd::IsConstOpnd((Opnd *)&this_01->field_0);
        if (!bVar9) {
          local_38 = this_01[4];
          paVar25 = &local_38;
          bVar9 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
          if (!bVar9) {
            local_38 = this_01[4];
            bVar9 = ValueType::IsObject((ValueType *)&local_38.field_0);
            if (!bVar9) {
              paVar25 = local_40 + 4;
              pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&this_01->field_0);
              LowererMD::GenerateObjectTest
                        ((LowererMD *)&paVar25->field_0,&pRVar19->super_Opnd,instr,local_88,false);
            }
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&this_01->field_0);
            paVar25 = local_40;
            GenerateJSBooleanTest((Lowerer *)&local_40->field_0,pRVar19,instr,local_88,false);
          }
        }
      }
      paVar5 = local_40;
      pbVar28 = local_50;
      LVar27 = ValueFalse - (local_54 & 0xff);
      pLVar22 = local_80;
      pLVar21 = local_98;
      if ((byte)local_54 != 0) {
        pLVar22 = local_98;
        pLVar21 = local_80;
      }
      if (bVar6) {
        if (local_35 != InstrKindBranch) {
          pOVar20 = instr->m_dst;
          valueType = LVar27;
LAB_00572b25:
          pOVar18 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,valueType);
          InsertMove(pOVar20,pOVar18,instr,true);
          pFVar24 = *(Func **)paVar5;
LAB_00572b4c:
          pBVar13 = IR::BranchInstr::New(JMP,pLVar14,pFVar24);
          IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
          pbVar28 = local_50;
          goto LAB_00572b60;
        }
        pFVar24 = *(Func **)local_40;
        pLVar14 = pLVar22;
        pLVar22 = pLVar21;
      }
      else {
        valueType = (local_54 & 0xff) + ValueTrue;
        if (!bVar7) {
          if (bVar4) {
            if (local_35 == InstrKindBranch) {
              paVar25 = local_40 + 4;
              pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
              pLVar14 = pLVar21;
              if (bVar8 != false) {
                pLVar14 = pLVar22;
              }
              LowererMD::GenerateTaggedZeroTest
                        ((LowererMD *)&paVar25->field_0,&pRVar19->super_Opnd,instr,pLVar14);
              paVar25 = local_40;
              pLVar14 = pLVar22;
              if (bVar8 != false) {
                pIVar15 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
                pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
                InsertCompareBranch((Lowerer *)&paVar26->field_0,&pIVar15->super_Opnd,
                                    &pRVar19->super_Opnd,BrNeq_A,pLVar22,instr,true);
                pLVar14 = pLVar21;
              }
              pFVar24 = *(Func **)paVar25;
              pbVar28 = local_50;
              goto LAB_0057311a;
            }
            local_34 = LVar27;
            pLVar21 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
            pLVar22 = IR::LabelInstr::New(Label,*(Func **)paVar5,false);
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
            LowererMD::GenerateTaggedZeroTest
                      ((LowererMD *)&paVar5[4].field_0,&pRVar19->super_Opnd,instr,pLVar22);
            LVar27 = local_34;
            if (bVar8 != false) {
              pIVar15 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
              pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
              InsertCompareBranch((Lowerer *)&paVar26->field_0,&pIVar15->super_Opnd,
                                  &pRVar19->super_Opnd,BrNeq_A,pLVar22,instr,true);
              local_54 = local_34;
              LVar27 = valueType;
              valueType = local_54;
            }
            local_54 = valueType;
            IR::Instr::InsertBefore(instr,&pLVar21->super_Instr);
            paVar25 = local_40;
            pOVar20 = instr->m_dst;
            pOVar18 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar27);
            InsertMove(pOVar20,pOVar18,instr,true);
            pBVar13 = IR::BranchInstr::New(JMP,pLVar14,*(Func **)paVar25);
            IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
            IR::Instr::InsertBefore(instr,&pLVar22->super_Instr);
            pOVar20 = instr->m_dst;
            pOVar18 = LoadLibraryValueOpnd((Lowerer *)&paVar25->field_0,instr,local_54);
            InsertMove(pOVar20,pOVar18,instr,true);
            pFVar24 = *(Func **)paVar25;
          }
          else {
            local_34 = LVar27;
            pLVar21 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
            instr_00 = IR::LabelInstr::New(Label,*(Func **)paVar5,false);
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
            local_48 = pLVar21;
            LowererMD::GenerateTaggedZeroTest
                      ((LowererMD *)&paVar5[4].field_0,&pRVar19->super_Opnd,instr,pLVar21);
            pIVar15 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)paVar5,true);
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
            IVar1 = local_35;
            if (local_35 != InstrKindBranch) {
              pLVar22 = instr_00;
            }
            InsertCompareBranch((Lowerer *)&paVar26->field_0,&pIVar15->super_Opnd,
                                &pRVar19->super_Opnd,BrNeq_A,pLVar22,instr,true);
            paVar25 = local_40;
            pLVar21 = local_48;
            if (IVar1 == InstrKindBranch) {
              paVar26 = local_40;
              pOVar20 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,ValueTrue);
              InsertCompareBranch((Lowerer *)&paVar26->field_0,(Opnd *)&this_01->field_0,pOVar20,
                                  instr->m_opcode,local_98,instr,false);
              pBVar13 = IR::BranchInstr::New(JMP,local_80,*(Func **)paVar25);
              IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
              IR::Instr::InsertBefore(instr,&local_48->super_Instr);
              paVar26 = paVar25;
              pOVar20 = LoadLibraryValueOpnd((Lowerer *)&paVar25->field_0,instr,ValueFalse);
              InsertCompareBranch((Lowerer *)&paVar26->field_0,(Opnd *)&this_01->field_0,pOVar20,
                                  instr->m_opcode,local_98,instr,false);
              pFVar24 = *(Func **)paVar25;
              pLVar14 = local_80;
            }
            else {
              if ((undefined1)local_54 == '\0') {
                InsertMove(instr->m_dst,(Opnd *)&this_01->field_0,instr,true);
              }
              else {
                GenerateBooleanNegate
                          ((Lowerer *)&paVar26->field_0,instr,(Opnd *)&this_01->field_0,instr->m_dst
                          );
              }
              pBVar13 = IR::BranchInstr::New(JMP,pLVar14,*(Func **)paVar25);
              IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
              this_00 = (Lowerer *)instr;
              IR::Instr::InsertBefore(instr,&pLVar21->super_Instr);
              if ((undefined1)local_54 == '\0') {
                GenerateBooleanNegate(this_00,instr,(Opnd *)&this_01->field_0,instr->m_dst);
              }
              else {
                InsertMove(instr->m_dst,(Opnd *)&this_01->field_0,instr,true);
              }
              pBVar13 = IR::BranchInstr::New(JMP,pLVar14,*(Func **)paVar25);
              IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
              IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
              pOVar20 = instr->m_dst;
              pOVar18 = LoadLibraryValueOpnd((Lowerer *)&paVar25->field_0,instr,local_34);
              InsertMove(pOVar20,pOVar18,instr,true);
              pFVar24 = *(Func **)paVar25;
            }
          }
          goto LAB_00572b4c;
        }
        if (!bVar4) {
          if (local_35 == InstrKindBranch) {
            if ((undefined1)local_34 == '\0') {
              pBVar13 = IR::BranchInstr::New(JMP,pLVar22,*(Func **)local_40);
              IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
              pLVar21->field_0x78 = pLVar21->field_0x78 | 0x20;
              goto LAB_00572b60;
            }
            paVar25 = local_40;
            pOVar20 = LoadLibraryValueOpnd
                                ((Lowerer *)&local_40->field_0,instr,ValueFalse - (byte)local_48);
            InsertCompareBranch((Lowerer *)&paVar25->field_0,(Opnd *)&this_01->field_0,pOVar20,
                                instr->m_opcode,local_98,instr,false);
            pFVar24 = *(Func **)paVar5;
            pLVar14 = local_80;
          }
          else if ((undefined1)local_34 == '\0') {
            pOVar20 = instr->m_dst;
            pOVar18 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar27);
            InsertMove(pOVar20,pOVar18,instr,true);
            pFVar24 = *(Func **)paVar5;
          }
          else {
            if ((byte)local_54 == (byte)local_48) {
              GenerateBooleanNegate
                        ((Lowerer *)&paVar25->field_0,instr,(Opnd *)&this_01->field_0,instr->m_dst);
            }
            else {
              InsertMove(instr->m_dst,(Opnd *)&this_01->field_0,instr,true);
            }
            pFVar24 = *(Func **)local_40;
          }
LAB_0057311a:
          pBVar13 = IR::BranchInstr::New(JMP,pLVar14,pFVar24);
          IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
          goto LAB_00572b60;
        }
        if (local_35 != InstrKindBranch) {
          if ((undefined1)local_34 == '\0') {
            valueType = LVar27;
          }
          pOVar20 = instr->m_dst;
          if ((bool)(byte)local_48 != bVar8) {
            valueType = LVar27;
          }
          goto LAB_00572b25;
        }
        pFVar24 = *(Func **)local_40;
        pLVar14 = pLVar21;
        if ((undefined1)local_34 != '\x01' || (bool)(byte)local_48 != bVar8) {
          pLVar14 = pLVar22;
          pLVar22 = pLVar21;
        }
      }
      pBVar13 = IR::BranchInstr::New(JMP,pLVar14,pFVar24);
      IR::Instr::InsertBefore(instr,&pBVar13->super_Instr);
      pLVar22->field_0x78 = pLVar22->field_0x78 | 0x20;
      pbVar28 = local_50;
LAB_00572b60:
      if (*pbVar28 != true) {
        return true;
      }
      IR::Instr::InsertBefore(instr,&local_88->super_Instr);
      return true;
    }
LAB_00572757:
    local_38 = paVar25[4];
    bVar7 = ValueType::IsLikelyTaggedInt((ValueType *)&local_38.field_0);
    if (bVar7) {
      local_56 = paVar26[4];
      bVar7 = ValueType::IsLikelyBoolean((ValueType *)&local_56.field_0);
      this_01 = paVar26;
      paVar26 = paVar25;
      if (bVar7) goto LAB_0057278a;
    }
  }
switchD_00572656_default:
switchD_00572625_caseD_3c:
  return false;
}

Assistant:

bool Lowerer::GenerateFastEqBoolInt(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    Assert(instr);

    // There's a total of 8 modes for this function, based on these inferred flags
    bool isBranchNotCompare = instr->IsBranchInstr();
    bool isStrict = false;
    bool isNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
        break;
    default:
        break;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
        isNegOp = false;
        break;
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    default:
        // This opcode is not one of the ones that should be handled here.
        return false;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    // The instrucions given to this _should_ all be 2-arg.
    Assert(src1 && src2);
    if (!(src1 && src2))
    {
        return false;
    }

    // If it's a branch instruction, we'll want these to be defined
    //IR::BranchInstr *instrBranch = nullptr;
    IR::LabelInstr *targetInstr = nullptr;
    IR::LabelInstr *labelFallthrough = nullptr;

    if (isBranchNotCompare)
    {
        IR::BranchInstr * instrBranch = instr->AsBranchInstr();
        targetInstr = instrBranch->GetTarget();
        labelFallthrough = instrBranch->GetOrCreateContinueLabel(isInHelper);
    }

    // Assume we need the helper until we can show otherwise.
    *pNeedHelper = true;
    // If we don't know the final types well enough at JIT time, a helper block to set
    // the inputs to the correct types will be needed.
    IR::LabelInstr *labelHelper = nullptr;
    // If we're doing a compare and can handle it early, then we want to skip the helper
    IR::LabelInstr *labelDone = instr->GetOrCreateContinueLabel(isInHelper);

    // Normallize for orderings
    IR::Opnd *srcBool = nullptr;
    IR::Opnd *srcInt = nullptr;
    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyTaggedInt())
    {
        srcBool = src1;
        srcInt = src2;
    }
    else if (src1->GetValueType().IsLikelyTaggedInt() && src2->GetValueType().IsLikelyBoolean())
    {
        srcInt = src1;
        srcBool = src2;
    }
    else
    {
        return false;
    }

    // If either instruction is constant, we can simplify the check. If both are constant, we can eliminate it
    bool srcIntConst = false;
    bool srcIntConstVal = false;
    // If we're comparing with a number that is not 0 or 1, then the two are inequal by default
    bool srcIntIsBoolable = false;
    bool srcBoolConst = false;
    bool srcBoolConstVal = false;
    if (srcInt->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcInt = srcInt->AsIntConstOpnd();
        IntConstType constIntVal = constSrcInt->GetValue();
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcInt = srcInt->AsAddrOpnd();
        if (!(addrSrcInt && addrSrcInt->IsVar() && Js::TaggedInt::Is(addrSrcInt->m_address)))
        {
            return false;
        }
        int32 constIntVal = Js::TaggedInt::ToInt32(addrSrcInt->m_address);
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }
    if (srcBool->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcBool = srcBool->AsIntConstOpnd();
        IntConstType constIntVal = constSrcBool->GetValue();
        srcBoolConst = true;
        srcBoolConstVal = constIntVal != 0;
    }
    else if (srcBool->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcBool = srcInt->AsAddrOpnd();
        if (!(addrSrcBool && addrSrcBool->IsVar() && Js::TaggedInt::Is(addrSrcBool->m_address)))
        {
            return false;
        }
        int32 value = Js::TaggedInt::ToInt32(addrSrcBool->m_address);
        srcBoolConst = true;
        srcBoolConstVal = value != 0;
    }
    else if (srcBool->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }

    // Do these checks here, since that way we avoid emitting instructions before exiting earlier
    if (srcInt->GetValueType().IsTaggedInt() && srcBool->GetValueType().IsBoolean()) {
        // ok, we know the types, so no helper needed
        *pNeedHelper = false;
    }
    else
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        // check the types and jump to the helper if incorrect
        if (!srcInt->IsConstOpnd() && !srcInt->GetValueType().IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(srcInt->AsRegOpnd(), instr, labelHelper);
        }
        if (!srcBool->IsConstOpnd() && !srcBool->GetValueType().IsBoolean())
        {
            if (!srcBool->GetValueType().IsObject())
            {
                this->m_lowererMD.GenerateObjectTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
            }
            GenerateJSBooleanTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
        }
    }

    // At this point, we know both which operand is an integer and which is a boolean,
    // whether either operand is constant, and what the constant true/false values are
    // for any constant operands. This should allow us to emit some decent code.

    LibraryValue equalResultValue = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue inequalResultValue = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    IR::LabelInstr *equalResultTarget = !isNegOp ? targetInstr : labelFallthrough;
    IR::LabelInstr *inequalResultTarget = !isNegOp ? labelFallthrough : targetInstr;

    // For the Sr instructions, we now know that the types are different, so we can immediately
    // decide what the result will be.
    if (isStrict)
    {
        if (isBranchNotCompare)
        {
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            equalResultTarget->m_noHelperAssert = true;
#endif
        }
        else
        {
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    // Now that we've checked the types, we can lower some instructions to quickly do the check
    // in the case that it's not a type-strict strict equality/inequality check.
    else if (srcIntConst && srcBoolConst)
    {
        // If both arguments are constant, we can statically determine the result.
        bool sameVal = srcIntConstVal == srcBoolConstVal;
        if (isBranchNotCompare)
        {
            // For constant branches, branch to the target
            Assert(instr);
            IR::LabelInstr * target = sameVal && srcIntIsBoolable ? equalResultTarget : inequalResultTarget;
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, target, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            (sameVal && srcIntIsBoolable ? inequalResultTarget : equalResultTarget)->m_noHelperAssert = true;
#endif
        }
        else
        {
            // For constant compares, load the constant result
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, sameVal && srcIntIsBoolable ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (!srcIntConst && !srcBoolConst)
    {
        // If neither is constant, we can still do a bit better than loading the helper
        IR::LabelInstr * firstFalse = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr * forceInequal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        // We branch based on the zero-ness of the integer argument to two checks against the boolean argument
        this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, firstFalse);
        // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
        // case the two will compare as inequal
        InsertCompareBranch(
            IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func, true),
            srcInt->AsRegOpnd(),
            Js::OpCode::BrNeq_A,
            isBranchNotCompare ? inequalResultTarget : forceInequal, // in the case of branching, we can go straight to the inequal target; for compares, we need to load the value
            instr,
            true);
        if (isBranchNotCompare)
        {
            // if the int evaluates to 1 (true)
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));

            // if the int evaluates to 0 (false)
            instr->InsertBefore(firstFalse);
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
        }
        else
        {
            // the int resolves to 1 (true)
            // Load either the bool or its complement into the dst reg, depending on the opcode
            if (isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to 0 (false)
            // Handle the complement case
            instr->InsertBefore(firstFalse);
            if (!isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to something other than 0 or 1 (inequal to a bool)
            instr->InsertBefore(forceInequal);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (srcIntConst)
    {
        if (isBranchNotCompare)
        {
            if (srcIntIsBoolable)
            {
                LibraryValue intval = srcIntConstVal ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
                InsertCompareBranch(
                    srcBool,
                    LoadLibraryValueOpnd(instr, intval),
                    instr->m_opcode,
                    targetInstr,
                    instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
            }
            else
            {
                // Since a constant int that isn't 0 or 1 will always be inequal to bools, just jump to the inequal result
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
                // Since we're not making a non-helper path to one of the branches, we need to tell
                // DbCheckPostLower that we are going to have a non-helper label without non-helper
                // branches.
                // Note: this following line isn't good practice in general
                equalResultTarget->m_noHelperAssert = true;
#endif
            }
        }
        else
        {
            if (srcIntIsBoolable)
            {
                bool directPassthrough = isNegOp != srcIntConstVal;
                if (directPassthrough)
                {
                    // If this case is hit, the result value is the same as the value in srcBool
                    this->InsertMove(instr->GetDst(), srcBool, instr);
                }
                else
                {
                    // Otherwise, the result value is the negation of the value in srcBool
                    GenerateBooleanNegate(instr, srcBool, instr->GetDst());
                }
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
            else
            {
                Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
        }
    }
    else if (srcBoolConst)
    {
        if (isBranchNotCompare)
        {
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, srcBoolConstVal ? inequalResultTarget : equalResultTarget);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, inequalResultTarget, instr, true);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, srcBoolConstVal ? equalResultTarget : inequalResultTarget, this->m_func));
        }
        else
        {
            IR::LabelInstr* isNonZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            IR::LabelInstr* isZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, isZero);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, isZero, instr, true);
            }
            instr->InsertBefore(isNonZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            instr->InsertBefore(isZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, !srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    if (*pNeedHelper)
    {
        instr->InsertBefore(labelHelper);
    }
    return true;
}